

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall
mkvparser::Tracks::ParseTrackEntry
          (Tracks *this,longlong track_start,longlong track_size,longlong element_start,
          longlong element_size,Track **pResult)

{
  IMkvReader *pReader;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  unsigned_long_long uVar7;
  long lVar8;
  Track **ppTVar9;
  ulong uVar10;
  ulong uVar11;
  ulong stop;
  uchar b;
  longlong id;
  longlong pos;
  longlong size;
  byte local_119;
  VideoTrack *local_118;
  ulong local_110;
  Tracks *local_108;
  Track **local_100;
  longlong local_f8;
  longlong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  Info local_a8;
  
  if (*pResult != (Track *)0x0) {
    return -1;
  }
  pReader = this->m_pSegment->m_pReader;
  stop = track_size + track_start;
  local_a8.codecPrivate = (uchar *)0x0;
  local_a8.codecPrivateSize = 0;
  local_a8.codecId = (char *)0x0;
  local_a8.codecNameAsUTF8 = (char *)0x0;
  local_a8.nameAsUTF8 = (char *)0x0;
  local_a8.language = (char *)0x0;
  local_a8.codecDelay = 0;
  local_a8.seekPreRoll = 0;
  local_a8.uid = 0;
  local_a8.defaultDuration = 0;
  local_a8.type = 0;
  local_a8.number = 0;
  local_a8.lacing = false;
  local_110 = 0xffffffffffffffff;
  local_e0 = 1;
  local_e8 = 0xffffffffffffffff;
  local_b8 = 0xffffffffffffffff;
  local_c8 = 0xffffffffffffffff;
  local_c0 = 0xffffffffffffffff;
  local_d0 = 0xffffffffffffffff;
  local_108 = this;
  local_100 = pResult;
  local_f8 = element_start;
  local_f0 = element_size;
  local_d8 = track_start;
  do {
    if ((long)stop <= (long)local_d8) {
      lVar4 = -2;
      if ((local_d8 != stop) || (local_a8.number < 1)) goto LAB_0012bdfa;
      ppTVar9 = local_108->m_trackEntries;
      goto LAB_0012bdde;
    }
    lVar4 = ParseElementHeader(pReader,(longlong *)&local_d8,stop,(longlong *)&local_118,
                               (longlong *)&local_b0);
    uVar2 = local_b0;
    uVar1 = local_d8;
    if ((lVar4 < 0) || (lVar4 = -2, (long)local_b0 < 0)) goto LAB_0012bdfa;
    lVar8 = local_a8.type;
    lVar5 = local_a8.number;
    uVar7 = local_a8.defaultDuration;
    if ((long)local_118 < 0x56aa) {
      if ((long)local_118 < 0xd7) {
        if (local_118 == (VideoTrack *)0x83) {
          lVar8 = UnserializeUInt(pReader,local_d8,local_b0);
          lVar5 = local_a8.number;
          uVar7 = local_a8.defaultDuration;
          if (0xfd < lVar8 - 1U) goto LAB_0012bdfa;
        }
        else {
          if (local_118 == (VideoTrack *)0x86) {
            lVar4 = UnserializeString(pReader,local_d8,local_b0,&local_a8.codecId);
            goto LAB_0012bc34;
          }
          if ((local_118 == (VideoTrack *)0x9c) &&
             (local_e0 = UnserializeUInt(pReader,local_d8,local_b0), lVar8 = local_a8.type,
             lVar5 = local_a8.number, uVar7 = local_a8.defaultDuration, 1 < local_e0))
          goto LAB_0012bdfa;
        }
      }
      else if ((long)local_118 < 0xe1) {
        if (local_118 == (VideoTrack *)0xd7) {
          lVar5 = UnserializeUInt(pReader,local_d8,local_b0);
          lVar8 = local_a8.type;
          uVar7 = local_a8.defaultDuration;
          if (0x7e < lVar5 - 1U) goto LAB_0012bdfa;
        }
        else if (local_118 == (VideoTrack *)0xe0) {
          local_c0 = local_d8;
          local_d0 = local_b0;
        }
      }
      else if (local_118 == (VideoTrack *)0xe1) {
        local_b8 = local_d8;
        local_c8 = local_b0;
      }
      else if (local_118 == (VideoTrack *)0x536e) {
        lVar4 = UnserializeString(pReader,local_d8,local_b0,&local_a8.nameAsUTF8);
        goto LAB_0012bc34;
      }
    }
    else if ((long)local_118 < 0x73c5) {
      if ((long)local_118 < 0x63a2) {
        if (local_118 == (VideoTrack *)0x56aa) {
          local_a8.codecDelay = UnserializeUInt(pReader,local_d8,local_b0);
          lVar8 = local_a8.type;
          lVar5 = local_a8.number;
          uVar7 = local_a8.defaultDuration;
        }
        else if (local_118 == (VideoTrack *)0x56bb) {
          local_a8.seekPreRoll = UnserializeUInt(pReader,local_d8,local_b0);
          lVar8 = local_a8.type;
          lVar5 = local_a8.number;
          uVar7 = local_a8.defaultDuration;
        }
      }
      else if (local_118 == (VideoTrack *)0x63a2) {
        if (local_a8.codecPrivate != (uchar *)0x0) {
          operator_delete__(local_a8.codecPrivate);
        }
        local_a8.codecPrivate = (uchar *)0x0;
        local_a8.codecPrivateSize = 0;
        lVar8 = local_a8.type;
        lVar5 = local_a8.number;
        uVar7 = local_a8.defaultDuration;
        if (uVar2 != 0) {
          lVar4 = -1;
          if ((0x80000000 < uVar2) ||
             (puVar6 = (uchar *)operator_new__(uVar2,(nothrow_t *)&std::nothrow),
             puVar6 == (uchar *)0x0)) goto LAB_0012bdfa;
          iVar3 = (**pReader->_vptr_IMkvReader)(pReader,uVar1,uVar2,puVar6);
          if (iVar3 != 0) {
            operator_delete__(puVar6);
            lVar4 = (long)iVar3;
            goto LAB_0012bdfa;
          }
          local_a8.codecPrivateSize = uVar2;
          lVar8 = local_a8.type;
          lVar5 = local_a8.number;
          uVar7 = local_a8.defaultDuration;
          local_a8.codecPrivate = puVar6;
        }
      }
      else if (local_118 == (VideoTrack *)0x6d80) {
        local_110 = local_d8;
        local_e8 = local_b0;
      }
    }
    else if ((long)local_118 < 0x23e383) {
      if (local_118 == (VideoTrack *)0x73c5) {
        if (8 < local_b0) goto LAB_0012bdfa;
        local_a8.uid = 0;
        uVar11 = local_d8;
        for (uVar10 = local_b0; lVar8 = local_a8.type, lVar5 = local_a8.number,
            uVar7 = local_a8.defaultDuration, uVar10 != 0; uVar10 = uVar10 - 1) {
          iVar3 = (**pReader->_vptr_IMkvReader)(pReader,uVar11,1,&local_119);
          if (iVar3 != 0) {
            lVar4 = (long)iVar3;
            goto LAB_0012bdfa;
          }
          local_a8.uid = (ulong)local_119 | local_a8.uid << 8;
          uVar11 = uVar11 + 1;
        }
      }
      else if (local_118 == (VideoTrack *)0x22b59c) {
        lVar4 = UnserializeString(pReader,local_d8,local_b0,&local_a8.language);
LAB_0012bc34:
        lVar8 = local_a8.type;
        lVar5 = local_a8.number;
        uVar7 = local_a8.defaultDuration;
        if (lVar4 != 0) goto LAB_0012bdfa;
      }
    }
    else if (local_118 == (VideoTrack *)0x23e383) {
      uVar7 = UnserializeUInt(pReader,local_d8,local_b0);
      lVar8 = local_a8.type;
      lVar5 = local_a8.number;
      if ((long)uVar7 < 0) goto LAB_0012bdfa;
    }
    else if (local_118 == (VideoTrack *)0x258688) {
      lVar4 = UnserializeString(pReader,local_d8,local_b0,&local_a8.codecNameAsUTF8);
      goto LAB_0012bc34;
    }
    local_a8.defaultDuration = uVar7;
    local_a8.number = lVar5;
    local_a8.type = lVar8;
    local_d8 = uVar1 + uVar2;
  } while ((long)local_d8 <= (long)stop);
  lVar4 = -2;
LAB_0012bdfa:
  Track::Info::Clear(&local_a8);
  return lVar4;
LAB_0012bdde:
  if (ppTVar9 == local_108->m_trackEntriesEnd) goto LAB_0012be1c;
  if ((*ppTVar9 != (Track *)0x0) && (((*ppTVar9)->m_info).number == local_a8.number))
  goto LAB_0012bdfa;
  ppTVar9 = ppTVar9 + 1;
  goto LAB_0012bdde;
LAB_0012be1c:
  if (0 < local_a8.type) {
    local_a8.lacing = 0 < (long)local_e0;
    if (local_a8.type == 2) {
      if (-1 < (long)local_c0 || (long)local_b8 < 0) goto LAB_0012bdfa;
      local_a8.settings.start = local_b8;
      local_a8.settings.size = local_c8;
      local_118 = (VideoTrack *)0x0;
      lVar4 = AudioTrack::Parse(local_108->m_pSegment,&local_a8,local_f8,local_f0,
                                (AudioTrack **)&local_118);
      if (lVar4 != 0) goto LAB_0012bdfa;
      *local_100 = &local_118->super_Track;
      if (local_118 == (VideoTrack *)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x175f,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < (long)local_110) {
        Track::ParseContentEncodingsEntry(&local_118->super_Track,local_110,local_e8);
      }
    }
    else if (local_a8.type == 1) {
      if (-1 < (long)local_b8 || (long)local_c0 < 0) goto LAB_0012bdfa;
      local_a8.settings.start = local_c0;
      local_a8.settings.size = local_d0;
      local_118 = (VideoTrack *)0x0;
      lVar4 = VideoTrack::Parse(local_108->m_pSegment,&local_a8,local_f8,local_f0,&local_118);
      if (lVar4 != 0) goto LAB_0012bdfa;
      *local_100 = &local_118->super_Track;
      if (local_118 == (VideoTrack *)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1749,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
      if (-1 < (long)local_110) {
        Track::ParseContentEncodingsEntry(&local_118->super_Track,local_110,local_e8);
      }
    }
    else {
      if ((-1 < (long)(local_b8 & local_c0)) || (local_a8.type == 0x21 && -1 < (long)local_110))
      goto LAB_0012bdfa;
      local_a8.settings.start = 0xffffffffffffffff;
      local_a8.settings.size = 0;
      local_118 = (VideoTrack *)0x0;
      lVar4 = Track::Create(local_108->m_pSegment,&local_a8,local_f8,local_f0,(Track **)&local_118);
      if (lVar4 != 0) goto LAB_0012bdfa;
      *local_100 = &local_118->super_Track;
      if (local_118 == (VideoTrack *)0x0) {
        __assert_fail("pResult",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x177b,
                      "long mkvparser::Tracks::ParseTrackEntry(long long, long long, long long, long long, Track *&) const"
                     );
      }
    }
    lVar4 = 0;
  }
  goto LAB_0012bdfa;
}

Assistant:

long Tracks::ParseTrackEntry(long long track_start, long long track_size,
                             long long element_start, long long element_size,
                             Track*& pResult) const {
  if (pResult)
    return -1;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = track_start;
  const long long track_stop = track_start + track_size;

  Track::Info info;

  info.type = 0;
  info.number = 0;
  info.uid = 0;
  info.defaultDuration = 0;

  Track::Settings v;
  v.start = -1;
  v.size = -1;

  Track::Settings a;
  a.start = -1;
  a.size = -1;

  Track::Settings e;  // content_encodings_settings;
  e.start = -1;
  e.size = -1;

  long long lacing = 1;  // default is true

  while (pos < track_stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, track_stop, id, size);

    if (status < 0)  // error
      return status;

    if (size < 0)
      return E_FILE_FORMAT_INVALID;

    const long long start = pos;

    if (id == libwebm::kMkvVideo) {
      v.start = start;
      v.size = size;
    } else if (id == libwebm::kMkvAudio) {
      a.start = start;
      a.size = size;
    } else if (id == libwebm::kMkvContentEncodings) {
      e.start = start;
      e.size = size;
    } else if (id == libwebm::kMkvTrackUID) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      info.uid = 0;

      long long pos_ = start;
      const long long pos_end = start + size;

      while (pos_ != pos_end) {
        unsigned char b;

        const int status = pReader->Read(pos_, 1, &b);

        if (status)
          return status;

        info.uid <<= 8;
        info.uid |= b;

        ++pos_;
      }
    } else if (id == libwebm::kMkvTrackNumber) {
      const long long num = UnserializeUInt(pReader, pos, size);

      if ((num <= 0) || (num > 127))
        return E_FILE_FORMAT_INVALID;

      info.number = static_cast<long>(num);
    } else if (id == libwebm::kMkvTrackType) {
      const long long type = UnserializeUInt(pReader, pos, size);

      if ((type <= 0) || (type > 254))
        return E_FILE_FORMAT_INVALID;

      info.type = static_cast<long>(type);
    } else if (id == libwebm::kMkvName) {
      const long status =
          UnserializeString(pReader, pos, size, info.nameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvLanguage) {
      const long status = UnserializeString(pReader, pos, size, info.language);

      if (status)
        return status;
    } else if (id == libwebm::kMkvDefaultDuration) {
      const long long duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;

      info.defaultDuration = static_cast<unsigned long long>(duration);
    } else if (id == libwebm::kMkvCodecID) {
      const long status = UnserializeString(pReader, pos, size, info.codecId);

      if (status)
        return status;
    } else if (id == libwebm::kMkvFlagLacing) {
      lacing = UnserializeUInt(pReader, pos, size);

      if ((lacing < 0) || (lacing > 1))
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvCodecPrivate) {
      delete[] info.codecPrivate;
      info.codecPrivate = NULL;
      info.codecPrivateSize = 0;

      const size_t buflen = static_cast<size_t>(size);

      if (buflen) {
        unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);

        if (buf == NULL)
          return -1;

        const int status = pReader->Read(pos, static_cast<long>(buflen), buf);

        if (status) {
          delete[] buf;
          return status;
        }

        info.codecPrivate = buf;
        info.codecPrivateSize = buflen;
      }
    } else if (id == libwebm::kMkvCodecName) {
      const long status =
          UnserializeString(pReader, pos, size, info.codecNameAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvCodecDelay) {
      info.codecDelay = UnserializeUInt(pReader, pos, size);
    } else if (id == libwebm::kMkvSeekPreRoll) {
      info.seekPreRoll = UnserializeUInt(pReader, pos, size);
    }

    pos += size;  // consume payload
    if (pos > track_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != track_stop)
    return E_FILE_FORMAT_INVALID;

  if (info.number <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  if (GetTrackByNumber(info.number))
    return E_FILE_FORMAT_INVALID;

  if (info.type <= 0)  // not specified
    return E_FILE_FORMAT_INVALID;

  info.lacing = (lacing > 0) ? true : false;

  if (info.type == Track::kVideo) {
    if (v.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = v;

    VideoTrack* pTrack = NULL;

    const long status = VideoTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else if (info.type == Track::kAudio) {
    if (a.start < 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings = a;

    AudioTrack* pTrack = NULL;

    const long status = AudioTrack::Parse(m_pSegment, info, element_start,
                                          element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);

    if (e.start >= 0)
      pResult->ParseContentEncodingsEntry(e.start, e.size);
  } else {
    // neither video nor audio - probably metadata or subtitles

    if (a.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (v.start >= 0)
      return E_FILE_FORMAT_INVALID;

    if (info.type == Track::kMetadata && e.start >= 0)
      return E_FILE_FORMAT_INVALID;

    info.settings.start = -1;
    info.settings.size = 0;

    Track* pTrack = NULL;

    const long status =
        Track::Create(m_pSegment, info, element_start, element_size, pTrack);

    if (status)
      return status;

    pResult = pTrack;
    assert(pResult);
  }

  return 0;  // success
}